

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_sse_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [64];
  size_t i;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  undefined1 (*pauVar7) [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [32];
  undefined1 auStack_d8 [16];
  undefined1 local_c8 [32];
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  undefined1 auStack_88 [8];
  uint16_t buffer [8];
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  undefined1 auStack_38 [16];
  undefined1 auStack_28 [16];
  undefined1 auStack_18 [16];
  
  if ((len & 0x7f) != 0) {
    uVar2 = (ulong)(len & 0xffffff80);
    auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar26 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar28 = vpbroadcastd_avx512f();
      auVar28 = vpsrlvd_avx512f(auVar28,auVar26);
      auVar28 = vpandd_avx512f(auVar28,auVar27);
      auVar25 = vpaddd_avx512f(auVar28,auVar25);
      uVar2 = uVar2 + 1;
    } while (uVar2 < len);
    auVar25 = vmovdqu64_avx512f(auVar25);
    *(undefined1 (*) [64])flags = auVar25;
  }
  uVar6 = len >> 3 & 0xfffffff0;
  uVar2 = (ulong)uVar6;
  if (uVar6 != 0) {
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    uVar3 = 0;
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar29._8_2_ = 1;
    auVar29._0_8_ = 0x1000100010001;
    auVar29._10_2_ = 1;
    auVar29._12_2_ = 1;
    auVar29._14_2_ = 1;
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar30 = (undefined1  [16])0x0;
    do {
      auVar32 = vmovdqu64_avx512f(auVar27);
      _auStack_88 = vmovdqu64_avx512f(auVar27);
      _local_c8 = vmovdqu64_avx512f(auVar27);
      auVar1 = vmovdqu64_avx512f(auVar27);
      _auStack_f8 = auVar1._16_48_;
      uVar4 = uVar3 + 0xffff;
      if (uVar2 - uVar3 < 0x10000) {
        uVar4 = uVar2;
      }
      if (uVar3 < uVar4) {
        auStack_f8._0_16_ = auVar1._16_16_;
        auVar8 = vmovdqa64_avx512vl(auStack_f8._0_16_);
        auStack_f8._16_16_ = auVar1._32_16_;
        auVar9 = vmovdqa64_avx512vl(auStack_f8._16_16_);
        auStack_d8 = auVar1._48_16_;
        auVar10 = vmovdqa64_avx512vl(auStack_d8);
        auVar11 = vmovdqa64_avx512vl(local_c8._0_16_);
        auVar12 = vmovdqa64_avx512vl(local_c8._16_16_);
        auVar13 = vmovdqa64_avx512vl(auStack_a8);
        auVar14 = vmovdqa64_avx512vl(auStack_98);
        local_48 = auVar32._0_16_;
        auStack_38 = auVar32._16_16_;
        auStack_28 = auVar32._32_16_;
        auStack_18 = auVar32._48_16_;
        pauVar7 = (undefined1 (*) [16])(array + uVar3 * 8 + 0x78);
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar15 = vmovdqu64_avx512vl(pauVar7[-0xf]);
          auVar16 = vmovdqu64_avx512vl(pauVar7[-0xe]);
          auVar17 = vmovdqu64_avx512vl(pauVar7[-0xd]);
          auVar18 = vmovdqu64_avx512vl(pauVar7[-0xc]);
          auVar19 = vpxorq_avx512vl(auVar15,auVar31._0_16_);
          auVar20 = vpandq_avx512vl(auVar19,auVar16);
          auVar15 = vpternlogq_avx512vl(auVar20,auVar15,auVar31._0_16_,0xf8);
          auVar16 = vpxorq_avx512vl(auVar19,auVar16);
          auVar19 = vpxorq_avx512vl(auVar16,auVar17);
          auVar20 = vpandq_avx512vl(auVar19,auVar18);
          auVar16 = vpternlogq_avx512vl(auVar20,auVar16,auVar17,0xf8);
          auVar17 = vpxorq_avx512vl(auVar19,auVar18);
          auVar18 = vpxorq_avx512vl(auVar15,auVar28._0_16_);
          auVar19 = vpandq_avx512vl(auVar16,auVar18);
          auVar15 = vpternlogq_avx512vl(auVar19,auVar15,auVar28._0_16_,0xf8);
          auVar16 = vpxorq_avx512vl(auVar16,auVar18);
          auVar18 = vmovdqu64_avx512vl(pauVar7[-0xb]);
          auVar19 = vmovdqu64_avx512vl(pauVar7[-10]);
          auVar20 = vpxorq_avx512vl(auVar17,auVar18);
          auVar21 = vpandq_avx512vl(auVar20,auVar19);
          auVar17 = vpternlogq_avx512vl(auVar21,auVar17,auVar18,0xf8);
          auVar18 = vpxorq_avx512vl(auVar20,auVar19);
          auVar19 = vmovdqu64_avx512vl(pauVar7[-9]);
          auVar20 = vmovdqu64_avx512vl(pauVar7[-8]);
          auVar21 = vpxorq_avx512vl(auVar18,auVar19);
          auVar22 = vpandq_avx512vl(auVar21,auVar20);
          auVar18 = vpternlogq_avx512vl(auVar22,auVar18,auVar19,0xf8);
          auVar19 = vpxorq_avx512vl(auVar21,auVar20);
          auVar20 = vpxorq_avx512vl(auVar17,auVar16);
          auVar21 = vpandq_avx512vl(auVar18,auVar20);
          auVar16 = vpternlogq_avx512vl(auVar21,auVar17,auVar16,0xf8);
          auVar17 = vpxorq_avx512vl(auVar18,auVar20);
          auVar18 = vpxorq_avx512vl(auVar15,auVar26._0_16_);
          auVar20 = vpandq_avx512vl(auVar16,auVar18);
          auVar20 = vpternlogq_avx512vl(auVar20,auVar15,auVar26._0_16_,0xf8);
          auVar15 = vpxorq_avx512vl(auVar16,auVar18);
          auVar16 = vmovdqu64_avx512vl(pauVar7[-7]);
          auVar18 = vmovdqu64_avx512vl(pauVar7[-6]);
          auVar21 = vpxorq_avx512vl(auVar19,auVar16);
          auVar22 = vpandq_avx512vl(auVar21,auVar18);
          auVar16 = vpternlogq_avx512vl(auVar22,auVar19,auVar16,0xf8);
          auVar18 = vpxorq_avx512vl(auVar21,auVar18);
          auVar19 = vmovdqu64_avx512vl(pauVar7[-5]);
          auVar21 = vmovdqu64_avx512vl(pauVar7[-4]);
          auVar22 = vpxorq_avx512vl(auVar18,auVar19);
          auVar23 = vpandq_avx512vl(auVar22,auVar21);
          auVar18 = vpternlogq_avx512vl(auVar23,auVar18,auVar19,0xf8);
          auVar19 = vpxorq_avx512vl(auVar22,auVar21);
          auVar21 = vpxorq_avx512vl(auVar16,auVar17);
          auVar22 = vpandq_avx512vl(auVar18,auVar21);
          auVar16 = vpternlogq_avx512vl(auVar22,auVar16,auVar17,0xf8);
          auVar17 = vpxorq_avx512vl(auVar18,auVar21);
          auVar18 = vmovdqu64_avx512vl(pauVar7[-3]);
          auVar21 = vmovdqu64_avx512vl(pauVar7[-2]);
          auVar22 = vpxorq_avx512vl(auVar19,auVar18);
          auVar23 = vpandq_avx512vl(auVar22,auVar21);
          auVar18 = vpternlogq_avx512vl(auVar23,auVar19,auVar18,0xf8);
          auVar19 = vpxorq_avx512vl(auVar22,auVar21);
          auVar21 = vmovdqu64_avx512vl(pauVar7[-1]);
          auVar22 = vmovdqu64_avx512vl(*pauVar7);
          auVar23 = vpxorq_avx512vl(auVar19,auVar21);
          auVar24 = vpandq_avx512vl(auVar23,auVar22);
          auVar19 = vpternlogq_avx512vl(auVar24,auVar19,auVar21,0xf8);
          auVar21 = vpxorq_avx512vl(auVar23,auVar22);
          auVar31 = ZEXT1664(auVar21);
          auVar21 = vpxorq_avx512vl(auVar18,auVar17);
          auVar22 = vpandq_avx512vl(auVar19,auVar21);
          auVar17 = vpternlogq_avx512vl(auVar22,auVar18,auVar17,0xf8);
          auVar18 = vpxorq_avx512vl(auVar19,auVar21);
          auVar28 = ZEXT1664(auVar18);
          auVar18 = vpxorq_avx512vl(auVar16,auVar15);
          auVar19 = vpandq_avx512vl(auVar17,auVar18);
          auVar16 = vpternlogq_avx512vl(auVar19,auVar16,auVar15,0xf8);
          auVar15 = vpxorq_avx512vl(auVar17,auVar18);
          auVar26 = ZEXT1664(auVar15);
          auVar15 = vpandq_avx512vl(auVar30,auVar29);
          auVar15 = vpaddw_avx512vl(auVar32._0_16_,auVar15);
          auVar32 = ZEXT1664(auVar15);
          auVar17 = vpsrlw_avx512vl(auVar30,1);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auVar8 = vpaddw_avx512vl(auVar8,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,2);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auVar9 = vpaddw_avx512vl(auVar9,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,3);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auVar10 = vpaddw_avx512vl(auVar10,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,4);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auVar11 = vpaddw_avx512vl(auVar11,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,5);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auVar12 = vpaddw_avx512vl(auVar12,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,6);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auVar13 = vpaddw_avx512vl(auVar13,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,7);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auVar14 = vpaddw_avx512vl(auVar14,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,8);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          _auStack_88 = vpaddw_avx512vl(_auStack_88,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,9);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          register0x000008fc = vpaddw_avx512vl(unique0x10000116,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,10);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auStack_68 = vpaddw_avx512vl(auStack_68,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,0xb);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auStack_58 = vpaddw_avx512vl(auStack_58,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,0xc);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          local_48 = vpaddw_avx512vl(local_48,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,0xd);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auStack_38 = vpaddw_avx512vl(auStack_38,auVar17);
          auVar17 = vpsrlw_avx512vl(auVar30,0xe);
          auVar17 = vpandq_avx512vl(auVar17,auVar29);
          auStack_28 = vpaddw_avx512vl(auStack_28,auVar17);
          auVar30 = vpsrlw_avx(auVar30,0xf);
          auStack_18 = vpaddw_avx(auStack_18,auVar30);
          auVar17 = vpxorq_avx512vl(auVar20,auVar25._0_16_);
          auVar30 = vpandq_avx512vl(auVar16,auVar17);
          auVar30 = vpternlogq_avx512vl(auVar30,auVar20,auVar25._0_16_,0xf8);
          auVar16 = vpxorq_avx512vl(auVar16,auVar17);
          auVar25 = ZEXT1664(auVar16);
          uVar3 = uVar3 + 0x10;
          pauVar7 = pauVar7 + 0x10;
        } while (uVar3 < uVar4);
        auStack_f8._0_16_ = vmovdqa64_avx512vl(auVar8);
        local_108 = auVar1._0_16_;
        auStack_f8._16_16_ = vmovdqa64_avx512vl(auVar9);
        auStack_d8 = vmovdqa64_avx512vl(auVar10);
        local_c8._0_16_ = vmovdqa64_avx512vl(auVar11);
        local_c8._16_16_ = vmovdqa64_avx512vl(auVar12);
        auStack_a8 = vmovdqa64_avx512vl(auVar13);
        auStack_98 = vmovdqa64_avx512vl(auVar14);
      }
      else {
        auVar15 = (undefined1  [16])0x0;
      }
      local_108 = auVar15;
      lVar5 = 0;
      do {
        auVar15 = vpand_avx(auVar30,auVar29);
        auVar15 = vpaddw_avx(auVar15,*(undefined1 (*) [16])(local_108 + lVar5));
        *(undefined1 (*) [16])(local_108 + lVar5) = auVar15;
        auVar30 = vpsrlw_avx(auVar30,1);
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x100);
      lVar5 = 0;
      do {
        auVar33 = vpmovzxwd_avx2(*(undefined1 (*) [16])(local_108 + lVar5 * 4));
        auVar33 = vpslld_avx2(auVar33,4);
        auVar33 = vpaddd_avx2(auVar33,ZEXT432(*(uint *)((long)flags + lVar5)));
        auVar15 = vphaddd_avx(auVar33._16_16_,auVar33._0_16_);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        *(int *)((long)flags + lVar5) = auVar15._0_4_;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x40);
    } while (uVar3 < uVar2);
  }
  auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar5 = 0;
  auVar26 = vpmovsxbd_avx512f(_DAT_0011a080);
  auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
  do {
    auVar28 = vpbroadcastd_avx512f();
    auVar28 = vpsrlvd_avx512f(auVar28,auVar26);
    auVar28 = vpandd_avx512f(auVar28,auVar27);
    auVar25 = vpaddd_avx512f(auVar28,auVar25);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  auVar25 = vmovdqu64_avx512f(auVar25);
  *(undefined1 (*) [64])flags = auVar25;
  auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar5 = 0;
  auVar27 = vpbroadcastd_avx512f(ZEXT416(2));
  do {
    auVar28 = vpbroadcastd_avx512f();
    auVar28 = vpsrlvd_avx512f(auVar28,auVar26);
    auVar28 = vpaddd_avx512f(auVar28,auVar28);
    auVar28 = vpandd_avx512f(auVar28,auVar27);
    auVar25 = vpaddd_avx512f(auVar28,auVar25);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  auVar25 = vmovdqu64_avx512f(auVar25);
  *(undefined1 (*) [64])flags = auVar25;
  auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar5 = 0;
  auVar27 = vpbroadcastd_avx512f(ZEXT416(4));
  do {
    auVar28 = vpbroadcastd_avx512f();
    auVar28 = vpsrlvd_avx512f(auVar28,auVar26);
    auVar28 = vpslld_avx512f(auVar28,2);
    auVar28 = vpandd_avx512f(auVar28,auVar27);
    auVar25 = vpaddd_avx512f(auVar28,auVar25);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  auVar25 = vmovdqu64_avx512f(auVar25);
  *(undefined1 (*) [64])flags = auVar25;
  auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar5 = 0;
  auVar27 = vpbroadcastd_avx512f(ZEXT416(8));
  do {
    auVar28 = vpbroadcastd_avx512f();
    auVar28 = vpsrlvd_avx512f(auVar28,auVar26);
    auVar28 = vpslld_avx512f(auVar28,3);
    auVar28 = vpandd_avx512f(auVar28,auVar27);
    auVar25 = vpaddd_avx512f(auVar28,auVar25);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  auVar25 = vmovdqu64_avx512f(auVar25);
  *(undefined1 (*) [64])flags = auVar25;
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[16];

    while (i < limit) {        
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm_add_epi16(counter[pos], _mm_and_si128(v16, _mm_set1_epi16(1))); \
    v16 = _mm_srli_epi16(v16, 1); \
}
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
#undef U
        }

        // update the counters after the last iteration
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_add_epi16(counter[i], _mm_and_si128(v16, _mm_set1_epi16(1)));
            v16 = _mm_srli_epi16(v16, 1);
        }
        
        for (size_t i = 0; i < 16; ++i) {
            _mm_storeu_si128((__m128i*)buffer, counter[i]);
            for (size_t z = 0; z < 8; z++) {
                flags[i] += 16 * (uint32_t)buffer[z];
            }
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}